

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bipartition.h
# Opt level: O0

Bipartition * __thiscall Bipartition::operator~(Bipartition *this)

{
  Bipartition *in_RDI;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffa8;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffd8;
  Bipartition *in_stack_ffffffffffffffe0;
  
  getPartition(in_RDI);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~
            (in_stack_ffffffffffffffa8);
  Bipartition(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI);
  return in_RDI;
}

Assistant:

inline Bipartition operator~() const {
        return Bipartition(~(this->getPartition()));
    }